

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fIntegerStateQueryTests.cpp
# Opt level: O2

char * deqp::gles3::Functional::anon_unknown_2::getQueryTypeSuffix(QueryType type)

{
  if (type < QUERY_INDEXED_BOOLEAN) {
    return *(char **)(&DAT_01e35238 + (ulong)type * 8);
  }
  return (char *)0x0;
}

Assistant:

static const char* getQueryTypeSuffix (QueryType type)
{
	switch (type)
	{
		case QUERY_BOOLEAN:		return "_getboolean";
		case QUERY_INTEGER:		return "_getinteger";
		case QUERY_INTEGER64:	return "_getinteger64";
		case QUERY_FLOAT:		return "_getfloat";
		default:
			DE_ASSERT(DE_FALSE);
			return DE_NULL;
	}
}